

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::CFIReaderImpl::parseElement(CFIReaderImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IIrrXMLReader<char,_irr::io::IXMLBase> IVar2;
  size_type sVar3;
  pointer pcVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  FIValue *__tmp;
  string *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte *pbVar9;
  QName *pQVar10;
  long *plVar11;
  byte *pbVar12;
  runtime_error *this_00;
  DeadlyImportError *this_01;
  byte *pbVar13;
  ulong *puVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  byte bVar18;
  value_type *__x;
  bool bVar19;
  Attribute attr;
  __string_type __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  IIrrXMLReader<char,_irr::io::IXMLBase> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  value_type *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  uint local_7c;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  undefined1 local_58 [40];
  
  local_58._32_8_ = &this->attributes;
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  _M_erase_at_end((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                   *)local_58._32_8_,
                  (this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  pbVar12 = this->dataP;
  bVar18 = *pbVar12;
  uVar16 = (uint)bVar18;
  uVar17 = (uint)bVar18;
  if ((bVar18 & 0x3f) == 0x38) {
    pbVar9 = pbVar12 + 1;
    this->dataP = pbVar9;
    pbVar13 = this->dataEnd;
    local_7c = uVar16;
    if (pbVar13 == pbVar9 || (long)pbVar13 - (long)pbVar9 < 0) {
LAB_006386ed:
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_00638727;
    }
    this->dataP = pbVar12 + 2;
    bVar18 = pbVar12[1];
    if (bVar18 != 0xf0) {
      local_90 = &(this->vocabulary).prefixTable;
      paVar1 = &local_148.field_2;
      local_98 = (value_type *)&(this->vocabulary).namespaceNameTable;
      do {
        if ((bVar18 & 0xfc) != 0xcc) {
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_00638727;
        }
        local_128._8_8_ = 0;
        local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_a8._vptr_IIrrXMLReader = (_func_int **)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128._0_8_ = local_128 + 0x10;
        local_108._M_p = (pointer)&local_f8;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)0x0,0x6f7351);
        if ((bVar18 & 2) == 0) {
          local_148._M_string_length = 0;
          local_148.field_2._M_local_buf[0] = '\0';
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex(this,local_90);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        if ((bVar18 & 1) == 0) {
          local_148._M_string_length = 0;
          local_148.field_2._M_local_buf[0] = '\0';
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex
                             (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_98);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        if (local_e8._M_string_length == 0) {
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"xmlns","");
        }
        else {
          std::operator+(&local_148,"xmlns:",&local_e8);
        }
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_108._M_p,local_108._M_p + local_100);
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        p_Var8->_M_use_count = 1;
        p_Var8->_M_weak_count = 1;
        p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008cfee8;
        local_88 = p_Var8 + 1;
        *(_Atomic_word **)&p_Var8[1]._M_use_count = &p_Var8[2]._M_use_count;
        p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        *(undefined1 *)&p_Var8[2]._M_use_count = 0;
        p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__008cff38;
        std::__cxx11::string::operator=((string *)&p_Var8[1]._M_use_count,(string *)&local_148);
        _Var6._M_pi = _Stack_a0._M_pi;
        local_a8._vptr_IIrrXMLReader = (_func_int **)local_88;
        bVar19 = _Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_a0._M_pi = p_Var8;
        if (bVar19) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_58._32_8_,(value_type *)local_128);
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pbVar9 = this->dataP;
        pbVar13 = this->dataEnd;
        if ((long)pbVar13 - (long)pbVar9 < 1) goto LAB_006386ed;
        this->dataP = pbVar9 + 1;
        bVar18 = *pbVar9;
      } while (bVar18 != 0xf0);
    }
    if (((long)pbVar13 - (long)(pbVar9 + 1) < 1) || (uVar17 = local_7c, 0x3f < pbVar9[1])) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_00638727;
    }
  }
  pQVar10 = parseQualifiedNameOrIndex3(this,&(this->vocabulary).elementNameTable);
  sVar3 = (pQVar10->prefix)._M_string_length;
  if (sVar3 == 0) {
    local_128._0_8_ = local_128 + 0x10;
    pcVar4 = (pQVar10->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar4,pcVar4 + (pQVar10->name)._M_string_length);
  }
  else {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    pcVar4 = (pQVar10->prefix)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::_M_replace_aux((ulong)&local_148,local_148._M_string_length,0,'\x01');
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_148,(ulong)(pQVar10->name)._M_dataplus._M_p);
    local_128._0_8_ = local_128 + 0x10;
    puVar14 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar14) {
      local_128._16_8_ = *puVar14;
      local_128._24_8_ = plVar11[3];
    }
    else {
      local_128._16_8_ = *puVar14;
      local_128._0_8_ = (ulong *)*plVar11;
    }
    local_128._8_8_ = plVar11[1];
    *plVar11 = (long)puVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
  __x = &this->nodeName;
  std::__cxx11::string::_M_assign((string *)__x);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2)) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  pbVar12 = this->dataP;
  lVar15 = (long)this->dataEnd - (long)pbVar12;
  if ((uVar17 & 0x40) != 0) {
    local_98 = __x;
    if (0 < lVar15) {
      local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->vocabulary).attributeNameTable;
      IVar2._vptr_IIrrXMLReader = (_func_int **)(local_58 + 0x10);
      local_90 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(this->vocabulary).attributeValueTable;
      do {
        bVar18 = *pbVar12;
        if ((char)bVar18 < '\0') {
          if (0xef < bVar18) {
            this->emptyElement = bVar18 == 0xff;
            this->dataP = pbVar12 + 1;
            __x = local_98;
            if (bVar18 == 0xff) goto LAB_00638698;
            goto LAB_00638689;
          }
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_00638727;
        }
        local_128._0_8_ = local_128 + 0x10;
        local_128._8_8_ = 0;
        local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_a8._vptr_IIrrXMLReader = (_func_int **)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_108._M_p = (pointer)&local_f8;
        parseQualifiedNameOrIndex2
                  (this,(vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                         *)local_88);
        std::__cxx11::string::_M_assign((string *)local_128);
        std::__cxx11::string::_M_assign((string *)&local_108);
        std::__cxx11::string::_M_assign((string *)&local_e8);
        uVar5 = local_128._8_8_;
        if (local_128._8_8_ == 0) {
          local_58._0_8_ = IVar2._vptr_IIrrXMLReader;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_e8._M_dataplus._M_p,
                     local_e8._M_dataplus._M_p + local_e8._M_string_length);
        }
        else {
          local_78 = local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,local_128._0_8_,
                     (pointer)(local_128._0_8_ + local_128._8_8_));
          std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_78,(ulong)local_e8._M_dataplus._M_p);
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var8) {
            local_58._16_8_ = p_Var8->_vptr__Sp_counted_base;
            local_58._24_8_ = plVar11[3];
            local_58._0_8_ = IVar2._vptr_IIrrXMLReader;
          }
          else {
            local_58._16_8_ = p_Var8->_vptr__Sp_counted_base;
            local_58._0_8_ = (_func_int **)*plVar11;
          }
          local_58._8_8_ = plVar11[1];
          *plVar11 = (long)p_Var8;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
        }
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_58);
        if ((_func_int **)local_58._0_8_ != IVar2._vptr_IIrrXMLReader) {
          operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
        }
        if ((uVar5 != 0) && (local_78 != local_68)) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(string *)&parseErrorMessage_abi_cxx11_);
          *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        parseNonIdentifyingStringOrIndex1
                  ((CFIReaderImpl *)local_58,
                   (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                    *)this);
        uVar5 = local_58._8_8_;
        local_a8._vptr_IIrrXMLReader = (_func_int **)local_58._0_8_;
        _Var6._M_pi = _Stack_a0._M_pi;
        local_58._0_8_ = (_func_int **)0x0;
        local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if ((_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi),
           (uchar *)local_58._8_8_ != (uchar *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_58._32_8_,(value_type *)local_128);
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pbVar12 = this->dataP;
      } while (0 < (long)this->dataEnd - (long)pbVar12);
    }
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
LAB_00638727:
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (lVar15 < 1) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
    goto LAB_00638727;
  }
  if (*pbVar12 != 0xf0) {
    if (*pbVar12 != 0xff) {
      this->emptyElement = false;
LAB_00638689:
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->elementStack).c,__x);
      goto LAB_00638698;
    }
    this->terminatorPending = true;
  }
  this->emptyElement = true;
  this->dataP = pbVar12 + 1;
LAB_00638698:
  this->currentNodeType = EXN_ELEMENT;
  return;
}

Assistant:

void parseElement() {
        // C.3

        attributes.clear();

        uint8_t b = *dataP;
        bool hasAttributes = (b & 0x40) != 0; // C.3.3
        if ((b & 0x3f) == 0x38) { // C.3.4.1
            // Parse namespaces
            ++dataP;
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP++;
                if (b == 0xf0) { // C.3.4.3
                    break;
                }
                if ((b & 0xfc) != 0xcc) { // C.3.4.2
                    throw DeadlyImportError(parseErrorMessage);
                }
                // C.12
                Attribute attr;
                attr.qname.prefix = "xmlns";
                attr.qname.name = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
                attr.qname.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
                attr.name = attr.qname.name.empty() ? "xmlns" : "xmlns:" + attr.qname.name;
                attr.value = FIStringValue::create(std::string(attr.qname.uri));
                attributes.push_back(attr);
            }
            if ((dataEnd - dataP < 1) || (*dataP & 0xc0)) {
                throw DeadlyImportError(parseErrorMessage);
            }
        }

        // Parse Element name (C.3.5)
        const QName &elemName = parseQualifiedNameOrIndex3(vocabulary.elementNameTable);
        nodeName = elemName.prefix.empty() ? elemName.name : elemName.prefix + ':' + elemName.name;

        if (hasAttributes) {
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP;
                if (b < 0x80) { // C.3.6.1
                    // C.4
                    Attribute attr;
                    attr.qname = parseQualifiedNameOrIndex2(vocabulary.attributeNameTable);
                    attr.name = attr.qname.prefix.empty() ? attr.qname.name : attr.qname.prefix + ':' + attr.qname.name;
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    attr.value = parseNonIdentifyingStringOrIndex1(vocabulary.attributeValueTable);
                    attributes.push_back(attr);
                }
                else {
                    if ((b & 0xf0) != 0xf0) { // C.3.6.2
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    emptyElement = b == 0xff; // C.3.6.2, C.3.8
                    ++dataP;
                    break;
                }
            }
        }
        else {
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            b = *dataP;
            switch (b) {
            case 0xff:
                terminatorPending = true;
                // Intentionally fall through
            case 0xf0:
                emptyElement = true;
                ++dataP;
                break;
            default:
                emptyElement = false;
            }
        }
        if (!emptyElement) {
            elementStack.push(nodeName);
        }

        currentNodeType = irr::io::EXN_ELEMENT;
    }